

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# defyx.cpp
# Opt level: O0

void defyx_release_cache(defyx_cache *cache)

{
  defyx_cache *in_RDI;
  
  (*in_RDI->dealloc)(in_RDI);
  if (in_RDI != (defyx_cache *)0x0) {
    defyx_cache::~defyx_cache(in_RDI);
    operator_delete(in_RDI);
  }
  return;
}

Assistant:

void defyx_release_cache(defyx_cache* cache) {
		assert(cache != nullptr);
		cache->dealloc(cache);
		delete cache;
	}